

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editor.cpp
# Opt level: O1

void __thiscall CEditorImage::LoadAutoMapper(CEditorImage *this)

{
  json_type jVar1;
  IStorage *pIVar2;
  json_object_entry *pjVar3;
  int iVar4;
  undefined4 extraout_var;
  long lVar5;
  char *pcVar6;
  json_value *value;
  ulong uVar7;
  CDoodadsMapper *this_00;
  _func_int **pp_Var8;
  char *pcVar9;
  undefined8 uVar10;
  IConsole *pIVar11;
  uint size;
  _json_value *p_Var12;
  long in_FS_OFFSET;
  json_settings JsonSettings;
  char aError [256];
  char aBuf [512];
  json_settings local_368;
  char local_338 [256];
  char local_238 [512];
  long local_38;
  IOHANDLE io;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->m_pAutoMapper != (IAutoMapper *)0x0) goto LAB_0019460e;
  str_format(local_238,0x200,"editor/automap/%s.json",this->m_aName);
  pIVar2 = this->m_pEditor->m_pStorage;
  iVar4 = (*(pIVar2->super_IInterface)._vptr_IInterface[4])(pIVar2,local_238,1,0xffffffff,0,0,0,0);
  io = (IOHANDLE)CONCAT44(extraout_var,iVar4);
  if (io == (IOHANDLE)0x0) goto LAB_0019460e;
  lVar5 = io_length(io);
  size = (uint)lVar5;
  pcVar6 = (char *)mem_alloc(size);
  io_read(io,pcVar6,size);
  io_close(io);
  mem_zero(&local_368,0x30);
  value = json_parse_ex(&local_368,pcVar6,(long)(int)size,local_338);
  mem_free(pcVar6);
  if (value == (json_value *)0x0) {
    pIVar11 = this->m_pEditor->m_pConsole;
    pp_Var8 = (pIVar11->super_IInterface)._vptr_IInterface;
    pcVar9 = local_238;
    pcVar6 = local_338;
    uVar10 = 1;
  }
  else {
    jVar1 = value->type;
    p_Var12 = &json_value_none;
    if ((jVar1 == json_object) && (uVar7 = (ulong)(value->u).string.length, uVar7 != 0)) {
      pjVar3 = (value->u).object.values;
      lVar5 = 0;
      do {
        iVar4 = strcmp(*(char **)((long)&pjVar3->name + lVar5),"tileset");
        if (iVar4 == 0) {
          p_Var12 = *(_json_value **)((long)&pjVar3->value + lVar5);
          goto LAB_0019477f;
        }
        lVar5 = lVar5 + 0x18;
      } while (uVar7 * 0x18 != lVar5);
      p_Var12 = &json_value_none;
    }
LAB_0019477f:
    if (p_Var12->type == json_array) {
      this_00 = (CDoodadsMapper *)operator_new(0x28);
      CTilesetMapper::CTilesetMapper((CTilesetMapper *)this_00,this->m_pEditor);
LAB_00194826:
      this->m_pAutoMapper = &this_00->super_IAutoMapper;
      (*(this_00->super_IAutoMapper)._vptr_IAutoMapper[2])(this_00,p_Var12);
    }
    else {
      p_Var12 = &json_value_none;
      if ((jVar1 == json_object) && (uVar7 = (ulong)(value->u).string.length, uVar7 != 0)) {
        pjVar3 = (value->u).object.values;
        lVar5 = 0;
        do {
          iVar4 = strcmp(*(char **)((long)&pjVar3->name + lVar5),"doodads");
          if (iVar4 == 0) {
            p_Var12 = *(_json_value **)((long)&pjVar3->value + lVar5);
            goto LAB_00194805;
          }
          lVar5 = lVar5 + 0x18;
        } while (uVar7 * 0x18 != lVar5);
        p_Var12 = &json_value_none;
      }
LAB_00194805:
      if (p_Var12->type == json_array) {
        this_00 = (CDoodadsMapper *)operator_new(0x68);
        CDoodadsMapper::CDoodadsMapper(this_00,this->m_pEditor);
        goto LAB_00194826;
      }
    }
    json_value_free(value);
    if ((this->m_pAutoMapper == (IAutoMapper *)0x0) || (this->m_pEditor->m_pConfig->m_Debug == 0))
    goto LAB_0019460e;
    iVar4 = this->m_pAutoMapper->m_Type;
    pcVar6 = "";
    if (iVar4 == 1) {
      pcVar6 = "doodads";
    }
    pcVar9 = "tileset";
    if (iVar4 != 0) {
      pcVar9 = pcVar6;
    }
    pcVar6 = local_238;
    str_format(pcVar6,0x200,"loaded %s.json (%s)",this->m_aName,pcVar9);
    pIVar11 = this->m_pEditor->m_pConsole;
    pp_Var8 = (pIVar11->super_IInterface)._vptr_IInterface;
    pcVar9 = "editor";
    uVar10 = 2;
  }
  (*pp_Var8[0x19])(pIVar11,uVar10,pcVar9,pcVar6,0);
LAB_0019460e:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CEditorImage::LoadAutoMapper()
{
	if(m_pAutoMapper)
		return;

	// read file data into buffer
	char aBuf[IO_MAX_PATH_LENGTH];
	str_format(aBuf, sizeof(aBuf), "editor/automap/%s.json", m_aName);
	IOHANDLE File = m_pEditor->Storage()->OpenFile(aBuf, IOFLAG_READ, IStorage::TYPE_ALL);
	if(!File)
		return;
	int FileSize = (int)io_length(File);
	char *pFileData = (char *)mem_alloc(FileSize);
	io_read(File, pFileData, FileSize);
	io_close(File);

	// parse json data
	json_settings JsonSettings;
	mem_zero(&JsonSettings, sizeof(JsonSettings));
	char aError[256];
	json_value *pJsonData = json_parse_ex(&JsonSettings, pFileData, FileSize, aError);
	mem_free(pFileData);

	if(pJsonData == 0)
	{
		m_pEditor->Console()->Print(IConsole::OUTPUT_LEVEL_ADDINFO, aBuf, aError);
		return;
	}

	// generate configurations
	const json_value &rTileset = (*pJsonData)[(const char *)IAutoMapper::GetTypeName(IAutoMapper::TYPE_TILESET)];
	if(rTileset.type == json_array)
	{
		m_pAutoMapper = new CTilesetMapper(m_pEditor);
		m_pAutoMapper->Load(rTileset);
	}
	else
	{
		const json_value &rDoodads = (*pJsonData)[(const char *)IAutoMapper::GetTypeName(IAutoMapper::TYPE_DOODADS)];
		if(rDoodads.type == json_array)
		{
			m_pAutoMapper = new CDoodadsMapper(m_pEditor);
			m_pAutoMapper->Load(rDoodads);
		}
	}

	// clean up
	json_value_free(pJsonData);
	if(m_pAutoMapper && m_pEditor->Config()->m_Debug)
	{
		str_format(aBuf, sizeof(aBuf),"loaded %s.json (%s)", m_aName, IAutoMapper::GetTypeName(m_pAutoMapper->GetType()));
		m_pEditor->Console()->Print(IConsole::OUTPUT_LEVEL_DEBUG, "editor", aBuf);
	}
}